

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

void dashedSet(gdImagePtr im,int x,int y,int color,int *onP,int *dashStepP,int wid,int vert)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = *dashStepP + 1;
  uVar2 = (uint)(*onP == 0);
  if (iVar1 != 4) {
    uVar2 = *onP;
  }
  if (uVar2 != 0) {
    if (vert == 0) {
      if (0 < wid) {
        iVar3 = -(wid / 2) + x;
        iVar4 = wid + iVar3;
        do {
          gdImageSetPixel(im,iVar3,y,color);
          iVar3 = iVar3 + 1;
        } while (iVar3 < iVar4);
      }
    }
    else if (0 < wid) {
      iVar3 = -(wid / 2) + y;
      iVar4 = wid + iVar3;
      do {
        gdImageSetPixel(im,x,iVar3,color);
        iVar3 = iVar3 + 1;
      } while (iVar3 < iVar4);
    }
  }
  iVar3 = 0;
  if (iVar1 != 4) {
    iVar3 = iVar1;
  }
  *dashStepP = iVar3;
  *onP = uVar2;
  return;
}

Assistant:

static void
dashedSet (gdImagePtr im, int x, int y, int color,
		   int *onP, int *dashStepP, int wid, int vert)
{
	int dashStep = *dashStepP;
	int on = *onP;
	int w, wstart;

	dashStep++;
	if (dashStep == gdDashSize) {
		dashStep = 0;
		on = !on;
	}
	if (on) {
		if (vert) {
			wstart = y - wid / 2;
			for (w = wstart; w < wstart + wid; w++)
				gdImageSetPixel (im, x, w, color);
		} else {
			wstart = x - wid / 2;
			for (w = wstart; w < wstart + wid; w++)
				gdImageSetPixel (im, w, y, color);
		}
	}
	*dashStepP = dashStep;
	*onP = on;
}